

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

TidyMessageImpl *
formatAttributeReport
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  Lexer *pLVar5;
  long *plVar6;
  TidyMessageImpl *pTVar7;
  char *pcVar8;
  char *pcVar9;
  char tagdesc [64];
  char local_68 [64];
  
  TagToString(node,local_68,0x40);
  uVar3 = args->gp_offset;
  if ((ulong)uVar3 < 0x29) {
    plVar6 = (long *)((ulong)uVar3 + (long)args->reg_save_area);
    args->gp_offset = uVar3 + 8;
  }
  else {
    plVar6 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar6 + 1;
  }
  lVar4 = *plVar6;
  if (lVar4 == 0) {
    pcVar9 = "NULL";
    pcVar8 = "NULL";
  }
  else {
    pcVar9 = *(char **)(lVar4 + 0x28);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "NULL";
    }
    pcVar8 = *(char **)(lVar4 + 0x30);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "NULL";
    }
  }
  pTVar7 = (TidyMessageImpl *)0x0;
  if ((int)code < 0x266) {
    switch(code) {
    case 0x23c:
    case 0x240:
    case 0x242:
    case 0x244:
    case 0x245:
    case 0x24d:
    case 0x25c:
    case 0x25d:
switchD_0014f693_caseD_23c:
      pcVar9 = local_68;
LAB_0014f7b7:
      pTVar7 = prvTidytidyMessageCreateWithNode(doc,node,code,level,pcVar9);
      return pTVar7;
    case 0x23d:
    case 0x23e:
    case 0x23f:
    case 0x241:
    case 0x243:
    case 0x247:
    case 0x249:
    case 0x24a:
    case 0x24b:
    case 0x24c:
    case 0x24f:
    case 0x250:
    case 0x251:
    case 0x252:
    case 0x253:
    case 599:
    case 600:
    case 0x259:
    case 0x25a:
    case 0x25b:
      goto switchD_0014f693_caseD_23d;
    case 0x246:
    case 0x248:
switchD_0014f693_caseD_246:
      break;
    case 0x24e:
    case 0x256:
      break;
    case 0x254:
    case 0x255:
      HTMLVersion((TidyDocImpl *)(ulong)doc->lexer->doctype);
      break;
    case 0x25e:
      code = 0x25e;
      goto LAB_0014f7b7;
    default:
      switch(code) {
      case 0x223:
      case 0x224:
      case 0x226:
        goto switchD_0014f740_caseD_223;
      default:
        goto switchD_0014f693_caseD_23d;
      case 0x227:
        break;
      case 0x228:
      case 0x22a:
      case 0x22b:
        goto switchD_0014f693_caseD_246;
      case 0x229:
        goto switchD_0014f693_caseD_23c;
      }
    }
switchD_0014f693_caseD_24e:
    pcVar8 = pcVar9;
  }
  else {
    if (0x287 < (int)code) {
      if ((2 < code - 0x288) && (code != 0x290)) {
        if (code != 0x292) {
          return (TidyMessageImpl *)0x0;
        }
switchD_0014f740_caseD_223:
        goto LAB_0014f79e;
      }
      goto switchD_0014f693_caseD_23c;
    }
    if ((int)code < 0x26f) {
      if (code != 0x266) {
        if (code != 0x26e) {
          return (TidyMessageImpl *)0x0;
        }
        goto switchD_0014f740_caseD_223;
      }
      goto switchD_0014f693_caseD_23c;
    }
    if (code == 0x26f) goto switchD_0014f693_caseD_24e;
    if (code != 0x272) {
      if (code != 0x283) {
        return (TidyMessageImpl *)0x0;
      }
      pLVar5 = doc->lexer;
      uVar1 = doc->docIn->curcol;
      uVar2 = doc->docIn->curline;
      pLVar5->lines = uVar2;
      pLVar5->columns = uVar1;
      pTVar7 = prvTidytidyMessageCreateWithLexer(doc,0x283,level,local_68);
      return pTVar7;
    }
    code = 0x272;
  }
LAB_0014f79e:
  pTVar7 = prvTidytidyMessageCreateWithNode(doc,node,code,level,local_68,pcVar8);
switchD_0014f693_caseD_23d:
  return pTVar7;
}

Assistant:

TidyMessageImpl *formatAttributeReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    AttVal *av = NULL;
    char const *name = "NULL";
    char const *value = "NULL";
    char tagdesc[64];

    TagToString(node, tagdesc, sizeof(tagdesc));

    if ( ( av = va_arg(args, AttVal*) ) )
    {
        if (av->attribute)
            name = av->attribute;
        if (av->value)
            value = av->value;
    }

    switch (code)
    {
        case MISSING_QUOTEMARK_OPEN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, name );
		
        case BACKSLASH_IN_URI:
        case ESCAPED_ILLEGAL_URI:
        case FIXED_BACKSLASH:
        case ID_NAME_MISMATCH:
        case ILLEGAL_URI_CODEPOINT:
        case ILLEGAL_URI_REFERENCE:
        case INVALID_XML_ID:
        case MISSING_IMAGEMAP:
        case MISSING_QUOTEMARK:
        case NEWLINE_IN_URI:
        case UNEXPECTED_EQUALSIGN:
        case UNEXPECTED_GT:
        case UNEXPECTED_QUOTEMARK:
        case WHITE_IN_URI:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc );

        case ATTRIBUTE_IS_NOT_ALLOWED:
        case JOINING_ATTRIBUTE:
        case MISSING_ATTR_VALUE:
        case PROPRIETARY_ATTRIBUTE:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, name );

        case ATTRIBUTE_VALUE_REPLACED:
        case BAD_ATTRIBUTE_VALUE:
        case BAD_ATTRIBUTE_VALUE_REPLACED:
        case INSERTING_AUTO_ATTRIBUTE:
        case INVALID_ATTRIBUTE:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, name, value );

        case MISMATCHED_ATTRIBUTE_ERROR:
        case MISMATCHED_ATTRIBUTE_WARN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, name, HTMLVersion(doc));

        case ANCHOR_NOT_UNIQUE:
        case ANCHOR_DUPLICATED:
        case ATTR_VALUE_NOT_LCASE:
        case PROPRIETARY_ATTR_VALUE:
        case XML_ID_SYNTAX:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, value );

        case REPEATED_ATTRIBUTE:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, value, name );

        case UNEXPECTED_END_OF_FILE_ATTR:
            /* on end of file adjust reported position to end of input */
            doc->lexer->lines   = doc->docIn->curline;
            doc->lexer->columns = doc->docIn->curcol;
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, tagdesc );
    }

    return NULL;
}